

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodetree.c
# Opt level: O2

nodetree * NodeTree_DetachAndRelease(void *p)

{
  nodetree *pnVar1;
  
  pnVar1 = *(nodetree **)((long)p + 0x28);
  if (pnVar1 != (nodetree *)p) {
    (**(code **)(*(long *)((long)p + 8) + 0x48))(p,0,0);
    Node_Release(p);
    return pnVar1;
  }
  __assert_fail("(nodetree*)(p) != ((nodetree*)(p))->Next",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/nodetree.c"
                ,0x1f,"nodetree *NodeTree_DetachAndRelease(void *)");
}

Assistant:

nodetree* NodeTree_DetachAndRelease(void* p)
{
    nodetree* Next = NodeTree_Next(p);
    NodeTree_SetParent(p,NULL,NULL);
    Node_Release(p);
    return Next;
}